

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libwebsockets.c
# Opt level: O2

lws_tokenize_elem lws_tokenize(lws_tokenize *ts)

{
  size_t sVar1;
  byte c;
  ushort uVar2;
  byte *pbVar3;
  undefined2 uVar4;
  bool bVar5;
  int iVar6;
  lws_tokenize_elem lVar7;
  uint uVar8;
  int iVar9;
  void *pvVar10;
  ulong uVar11;
  ulong uVar12;
  bool bVar13;
  undefined4 extraout_EDX;
  undefined8 extraout_RDX;
  undefined8 uVar15;
  size_t sVar16;
  char cVar17;
  uint uVar18;
  uint uVar19;
  undefined5 uVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  ushort uVar25;
  ushort uVar26;
  ushort uVar27;
  ushort uVar28;
  long lStack_a0;
  char local_94;
  size_t local_90;
  uint local_74;
  uint local_70;
  uint local_6c;
  uint local_68;
  byte local_64;
  uint local_58;
  uint uStack_54;
  uint uStack_50;
  uint uStack_4c;
  uint local_48;
  uint uStack_44;
  uint uStack_40;
  uint uStack_3c;
  undefined4 uVar14;
  
  uVar2 = ts->flags;
  local_90 = 0;
  auVar21 = pshuflw(ZEXT216(uVar2),ZEXT216(uVar2),0);
  auVar21 = auVar21 & _DAT_0013b0a0;
  uVar25 = -(ushort)(auVar21._0_2_ == 0);
  uVar26 = -(ushort)(auVar21._2_2_ == 0);
  uVar27 = -(ushort)(auVar21._4_2_ == 0);
  uVar28 = -(ushort)(auVar21._6_2_ == 0);
  local_48 = (uint)(~uVar25 & 0x2d);
  uStack_44 = (uint)(~uVar26 & 0x2e);
  uStack_40 = (uint)(~uVar27 & 0x2a);
  uStack_3c = (uint)(~uVar28 & 0x3d);
  ts->token = (char *)0x0;
  ts->token_len = 0;
  local_58 = (uint)(uVar25 & 0x2d);
  uStack_54 = (uint)(uVar26 & 0x2e);
  uStack_50 = (uint)(uVar27 & 0x2a);
  uStack_4c = (uint)(uVar28 & 0x3d);
  local_68 = (uint)(uVar28 & 0x3d);
  bVar13 = true;
  lStack_a0 = 0;
  bVar5 = false;
  iVar6 = 0;
  uVar12 = (ulong)(byte)(((uVar2 >> 6 & 1) != 0) - 1);
  sVar1 = ts->len;
LAB_0010be99:
  sVar16 = sVar1;
  uVar11 = uVar12;
  uVar12 = uVar11 & 0xffffffff;
  uVar18 = (uint)lStack_a0;
  cVar17 = (char)uVar12;
  local_94 = (char)uVar2;
  if (sVar16 != 0) {
    pbVar3 = (byte *)ts->start;
    ts->start = (char *)(pbVar3 + 1);
    c = *pbVar3;
    sVar1 = sVar16 - 1;
    ts->len = sVar1;
    iVar6 = lws_check_byte_utf8((uchar)iVar6,c);
    if (iVar6 < 0) {
      return LWS_TOKZE_ERR_BROKEN_UTF8;
    }
    if (c != 0) {
      uVar15 = extraout_RDX;
      if ((!bVar13) && (c != 0xd)) goto code_r0x0010bf09;
      goto LAB_0010bf23;
    }
  }
  lVar7 = LWS_TOKZE_ERR_BROKEN_UTF8;
  if (iVar6 == 0) {
    if (uVar18 == 1) {
      lVar7 = LWS_TOKZE_ERR_UNTERM_STRING;
    }
    else if (uVar18 == 0) {
      if (((uVar2 & 4) == 0) || (lVar7 = LWS_TOKZE_ERR_COMMA_LIST, ts->delim != '\x02')) {
        lVar7 = LWS_TOKZE_ENDED;
      }
    }
    else {
LAB_0010c2a6:
      if (cVar17 == '\x01') {
        lVar7 = LWS_TOKZE_FLOAT - (uint)!bVar5;
      }
      else {
        lVar7 = LWS_TOKZE_TOKEN;
      }
    }
  }
  return lVar7;
code_r0x0010bf09:
  uVar15 = 0;
  bVar13 = false;
  if (c != 10) goto LAB_0010be99;
LAB_0010bf23:
  bVar13 = false;
  if ((uVar18 != 1 && local_94 < '\0') && c == 0x23) goto LAB_0010be99;
  if (c < 0x23) {
    if ((0x100003600U >> ((ulong)c & 0x3f) & 1) != 0) {
      lVar7 = (*(code *)(&DAT_0013b0c0 + *(int *)(&DAT_0013b0c0 + lStack_a0 * 4)))
                        (ts,c == 0x23,&DAT_0013b0c0 + *(int *)(&DAT_0013b0c0 + lStack_a0 * 4),uVar12
                        );
      return lVar7;
    }
    if ((ulong)c == 0x22) {
      if (uVar18 == 1) {
        return LWS_TOKZE_QUOTED_STRING;
      }
      if ((uVar2 & 4) != 0) {
        if (ts->delim == '\x01') {
          return LWS_TOKZE_ERR_COMMA_LIST;
        }
        ts->delim = '\x01';
      }
      ts->token = (char *)(pbVar3 + 1);
      ts->token_len = 0;
      local_90 = 0;
      goto LAB_0010c226;
    }
  }
  uVar8 = uVar18 & 0xfffffffe;
  local_64 = (byte)uVar28;
  if ((uVar8 == 2 & local_64 & c == 0x3d) == 1) {
    if (cVar17 == '\x01') {
      return LWS_TOKZE_ERR_NUM_ON_LHS;
    }
    return LWS_TOKZE_ERRS;
  }
  pvVar10 = (void *)(ulong)(uVar8 == 2);
  bVar13 = c == 0x3a && uVar8 == 2;
  uVar14 = (undefined4)CONCAT71((int7)((ulong)uVar15 >> 8),bVar13);
  if ((bVar13 & (byte)((uVar2 & 2) >> 1)) != 0) {
    return LWS_TOKZE_TOKEN_NAME_COLON;
  }
  if ((((c == 0x2e) && ((uVar2 & 0x20) == 0)) && (uVar18 == 2)) && (cVar17 == '\x01')) {
    if (bVar5) {
      return LWS_TOKZE_ERR_MALFORMED_FLOAT;
    }
    local_90 = local_90 + 1;
    ts->token_len = local_90;
    bVar5 = true;
    lStack_a0 = 2;
    bVar13 = true;
    uVar12 = CONCAT71((int7)(local_90 >> 8),1);
    goto LAB_0010be99;
  }
  if (iVar6 != 0) goto LAB_0010c060;
  uVar8 = (uint)(char)c;
  if ((((uVar2 & 8) == 0) ||
      (pvVar10 = memchr("(),/:;<=>?@[\\]{}",uVar8,0x11), uVar14 = extraout_EDX, (char)c < '!')) ||
     (pvVar10 == (void *)0x0)) {
    iVar9 = (int)pvVar10;
    auVar21[3] = (char)c >> 7;
    if ((((uVar2 & 8) == 0) && (iVar9 = c - 0x3a, (byte)iVar9 < 0xf6)) &&
       (iVar9 = c - 0x5b, (byte)iVar9 < 0xe6)) {
      uVar4 = CONCAT11(auVar21[3],auVar21[3]);
      uVar20 = CONCAT14(auVar21[3],uVar8);
      auVar21._4_4_ = (int)(CONCAT35(CONCAT21(uVar4,auVar21[3]),uVar20) >> 0x20);
      auVar21[2] = auVar21[3];
      auVar21[1] = c;
      auVar21[0] = c;
      auVar21._8_8_ = 0;
      auVar21 = pshuflw(auVar21,auVar21,0);
      uVar19 = auVar21._0_4_ >> 0x18;
      auVar22._0_4_ = -(uint)(uVar19 == local_48);
      auVar22._4_4_ = -(uint)(uVar19 == uStack_44);
      auVar22._8_4_ = -(uint)(uVar19 == uStack_40);
      auVar22._12_4_ = -(uint)(uVar19 == uStack_3c);
      iVar9 = movmskps(uVar14,auVar22);
      if (((((iVar9 == 0 && (byte)(c + 0x85) < 0xe6) && c != 0x5f) || (local_68 == uVar8)) ||
          (local_6c == uVar8)) || ((local_70 == uVar8 || (local_74 == uVar8)))) goto LAB_0010c1f9;
    }
    else {
      uVar4 = CONCAT11(auVar21[3],auVar21[3]);
      uVar20 = CONCAT14(auVar21[3],uVar8);
      auVar23._4_4_ = (int)(CONCAT35(CONCAT21(uVar4,auVar21[3]),uVar20) >> 0x20);
      auVar23[3] = auVar21[3];
      auVar23[2] = auVar21[3];
      auVar23[1] = c;
      auVar23[0] = c;
      auVar23._8_8_ = 0;
      auVar21 = pshuflw(auVar23,auVar23,0);
      uVar8 = auVar21._0_4_ >> 0x18;
      auVar24._0_4_ = -(uint)(uVar8 == local_58);
      auVar24._4_4_ = -(uint)(uVar8 == uStack_54);
      auVar24._8_4_ = -(uint)(uVar8 == uStack_50);
      auVar24._12_4_ = -(uint)(uVar8 == uStack_4c);
      iVar9 = movmskps(iVar9,auVar24);
      if (iVar9 != 0) goto LAB_0010c1f9;
    }
  }
  else {
LAB_0010c1f9:
    if (((byte)(uVar2 >> 8) & c == 0x2f) == 0) {
      if (uVar18 == 1) {
        local_90 = local_90 + 1;
        ts->token_len = local_90;
LAB_0010c226:
        lStack_a0 = 1;
        bVar13 = true;
        goto LAB_0010be99;
      }
      if (1 < uVar18 - 2) {
        if ((uVar2 & 4) != 0) {
          if (c != 0x2c) {
            return LWS_TOKZE_ERR_COMMA_LIST;
          }
          if (ts->delim != '\x01') {
            return LWS_TOKZE_ERR_COMMA_LIST;
          }
          ts->delim = '\x02';
        }
        ts->token = (char *)pbVar3;
        ts->token_len = 1;
        return LWS_TOKZE_DELIMITER;
      }
      goto LAB_0010c295;
    }
  }
LAB_0010c060:
  if (uVar18 - 1 < 2) {
    local_90 = local_90 + 1;
  }
  else {
    if (uVar18 != 0) {
LAB_0010c295:
      ts->start = (char *)pbVar3;
      ts->len = sVar16;
      goto LAB_0010c2a6;
    }
    if ((uVar2 & 4) != 0) {
      if (ts->delim == '\x01') {
        return LWS_TOKZE_ERR_COMMA_LIST;
      }
      ts->delim = '\x01';
    }
    ts->token = (char *)pbVar3;
    local_90 = 1;
    lStack_a0 = 2;
  }
  ts->token_len = local_90;
  bVar13 = true;
  if ((uVar2 & 0x40) == 0) {
    bVar13 = true;
    uVar12 = 0;
    if (0xf5 < (byte)(c - 0x3a)) {
      uVar12 = uVar11 & 0xff;
      if (cVar17 < '\0') {
        uVar12 = 1;
      }
      bVar13 = true;
    }
  }
  goto LAB_0010be99;
}

Assistant:

lws_tokenize_elem
lws_tokenize(struct lws_tokenize *ts)
{
	const char *rfc7230_delims = "(),/:;<=>?@[\\]{}";
	lws_tokenize_state state = LWS_TOKZS_LEADING_WHITESPACE;
	char c, flo = 0, d_minus = '-', d_dot = '.', d_star = '*', s_minus = '\0',
	     s_dot = '\0', s_star = '\0', d_eq = '=', s_eq = '\0', skipping = 0;
	signed char num = (ts->flags & LWS_TOKENIZE_F_NO_INTEGERS) ? 0 : -1;
	int utf8 = 0;

	/* for speed, compute the effect of the flags outside the loop */

	if (ts->flags & LWS_TOKENIZE_F_MINUS_NONTERM) {
		d_minus = '\0';
		s_minus = '-';
	}
	if (ts->flags & LWS_TOKENIZE_F_DOT_NONTERM) {
		d_dot = '\0';
		s_dot = '.';
	}
	if (ts->flags & LWS_TOKENIZE_F_ASTERISK_NONTERM) {
		d_star = '\0';
		s_star = '*';
	}
	if (ts->flags & LWS_TOKENIZE_F_EQUALS_NONTERM) {
		d_eq = '\0';
		s_eq = '=';
	}

	ts->token = NULL;
	ts->token_len = 0;

	while (ts->len) {
		c = *ts->start++;
		ts->len--;

		utf8 = lws_check_byte_utf8((unsigned char)utf8, (unsigned char)c);
		if (utf8 < 0)
			return LWS_TOKZE_ERR_BROKEN_UTF8;

		if (!c)
			break;

		if (skipping) {
			if (c != '\r' && c != '\n')
				continue;
			else
				skipping = 0;
		}

		/* comment */

		if (ts->flags & LWS_TOKENIZE_F_HASH_COMMENT &&
		    state != LWS_TOKZS_QUOTED_STRING &&
		    c == '#') {
			skipping = 1;
			continue;
		}

		/* whitespace */

		if (c == ' ' || c == '\t' || c == '\n' || c == '\r' ||
		    c == '\f') {
			switch (state) {
			case LWS_TOKZS_LEADING_WHITESPACE:
			case LWS_TOKZS_TOKEN_POST_TERMINAL:
				continue;
			case LWS_TOKZS_QUOTED_STRING:
				ts->token_len++;
				continue;
			case LWS_TOKZS_TOKEN:
				/* we want to scan forward to look for = */

				state = LWS_TOKZS_TOKEN_POST_TERMINAL;
				continue;
			}
		}

		/* quoted string */

		if (c == '\"') {
			if (state == LWS_TOKZS_QUOTED_STRING)
				return LWS_TOKZE_QUOTED_STRING;

			/* starting a quoted string */

			if (ts->flags & LWS_TOKENIZE_F_COMMA_SEP_LIST) {
				if (ts->delim == LWSTZ_DT_NEED_DELIM)
					return LWS_TOKZE_ERR_COMMA_LIST;
				ts->delim = LWSTZ_DT_NEED_DELIM;
			}

			state = LWS_TOKZS_QUOTED_STRING;
			ts->token = ts->start;
			ts->token_len = 0;

			continue;
		}

		/* token= aggregation */

		if (!(ts->flags & LWS_TOKENIZE_F_EQUALS_NONTERM) &&
		    c == '=' && (state == LWS_TOKZS_TOKEN_POST_TERMINAL ||
				 state == LWS_TOKZS_TOKEN)) {
			if (num == 1)
				return LWS_TOKZE_ERR_NUM_ON_LHS;
			/* swallow the = */
			return LWS_TOKZE_TOKEN_NAME_EQUALS;
		}

		/* optional token: aggregation */

		if ((ts->flags & LWS_TOKENIZE_F_AGG_COLON) && c == ':' &&
		    (state == LWS_TOKZS_TOKEN_POST_TERMINAL ||
		     state == LWS_TOKZS_TOKEN))
			/* swallow the : */
			return LWS_TOKZE_TOKEN_NAME_COLON;

		/* aggregate . in a number as a float */

		if (c == '.' && !(ts->flags & LWS_TOKENIZE_F_NO_FLOATS) &&
		    state == LWS_TOKZS_TOKEN && num == 1) {
			if (flo)
				return LWS_TOKZE_ERR_MALFORMED_FLOAT;
			flo = 1;
			ts->token_len++;
			continue;
		}

		/*
		 * Delimiter... by default anything that:
		 *
		 *  - isn't matched earlier, or
		 *  - is [A-Z, a-z, 0-9, _], and
		 *  - is not a partial utf8 char
		 *
		 * is a "delimiter", it marks the end of a token and is itself
		 * reported as a single LWS_TOKZE_DELIMITER each time.
		 *
		 * However with LWS_TOKENIZE_F_RFC7230_DELIMS flag, tokens may
		 * contain any noncontrol character that isn't defined in
		 * rfc7230_delims, and only characters listed there are treated
		 * as delimiters.
		 */

		if (!utf8 &&
		     ((ts->flags & LWS_TOKENIZE_F_RFC7230_DELIMS &&
		     strchr(rfc7230_delims, c) && c > 32) ||
		    ((!(ts->flags & LWS_TOKENIZE_F_RFC7230_DELIMS) &&
		     (c < '0' || c > '9') && (c < 'A' || c > 'Z') &&
		     (c < 'a' || c > 'z') && c != '_') &&
		     c != s_minus && c != s_dot && c != s_star && c != s_eq) ||
		    c == d_minus || c == d_dot || c == d_star || c == d_eq
		    ) &&
		    !((ts->flags & LWS_TOKENIZE_F_SLASH_NONTERM) && c == '/')) {
			switch (state) {
			case LWS_TOKZS_LEADING_WHITESPACE:
				if (ts->flags & LWS_TOKENIZE_F_COMMA_SEP_LIST) {
					if (c != ',' ||
					    ts->delim != LWSTZ_DT_NEED_DELIM)
						return LWS_TOKZE_ERR_COMMA_LIST;
					ts->delim = LWSTZ_DT_NEED_NEXT_CONTENT;
				}

				ts->token = ts->start - 1;
				ts->token_len = 1;
				return LWS_TOKZE_DELIMITER;

			case LWS_TOKZS_QUOTED_STRING:
				ts->token_len++;
				continue;

			case LWS_TOKZS_TOKEN_POST_TERMINAL:
			case LWS_TOKZS_TOKEN:
				/* report the delimiter next time */
				ts->start--;
				ts->len++;
				goto token_or_numeric;
			}
		}

		/* anything that's not whitespace or delimiter is payload */

		switch (state) {
		case LWS_TOKZS_LEADING_WHITESPACE:

			if (ts->flags & LWS_TOKENIZE_F_COMMA_SEP_LIST) {
				if (ts->delim == LWSTZ_DT_NEED_DELIM)
					return LWS_TOKZE_ERR_COMMA_LIST;
				ts->delim = LWSTZ_DT_NEED_DELIM;
			}

			state = LWS_TOKZS_TOKEN;
			ts->token = ts->start - 1;
			ts->token_len = 1;
			goto checknum;

		case LWS_TOKZS_QUOTED_STRING:
		case LWS_TOKZS_TOKEN:
			ts->token_len++;
checknum:
			if (!(ts->flags & LWS_TOKENIZE_F_NO_INTEGERS)) {
				if (c < '0' || c > '9')
					num = 0;
				else
					if (num < 0)
						num = 1;
			}
			continue;

		case LWS_TOKZS_TOKEN_POST_TERMINAL:
			/* report the new token next time */
			ts->start--;
			ts->len++;
			goto token_or_numeric;
		}
	}

	/* we ran out of content */

	if (utf8) /* ended partway through a multibyte char */
		return LWS_TOKZE_ERR_BROKEN_UTF8;

	if (state == LWS_TOKZS_QUOTED_STRING)
		return LWS_TOKZE_ERR_UNTERM_STRING;

	if (state != LWS_TOKZS_TOKEN_POST_TERMINAL &&
	    state != LWS_TOKZS_TOKEN) {
		if ((ts->flags & LWS_TOKENIZE_F_COMMA_SEP_LIST) &&
		     ts->delim == LWSTZ_DT_NEED_NEXT_CONTENT)
			return LWS_TOKZE_ERR_COMMA_LIST;

		return LWS_TOKZE_ENDED;
	}

	/* report the pending token */

token_or_numeric:

	if (num != 1)
		return LWS_TOKZE_TOKEN;
	if (flo)
		return LWS_TOKZE_FLOAT;

	return LWS_TOKZE_INTEGER;
}